

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestP4.cxx
# Opt level: O3

void __thiscall cmCTestP4::DescribeParser::NextSection(DescribeParser *this)

{
  SectionType SVar1;
  uint uVar2;
  undefined1 local_130 [32];
  _Alloc_hider local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  _Alloc_hider local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  _Alloc_hider local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  _Alloc_hider local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  _Alloc_hider local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  _Alloc_hider local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  _Alloc_hider local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  SVar1 = this->Section;
  if (SVar1 == SectionDiff) {
    (*(this->P4->super_cmCTestGlobalVC).super_cmCTestVC._vptr_cmCTestVC[8])
              (this->P4,&this->Rev,&this->Changes);
    memset(local_130 + 0x10,0,0xf0);
    local_130._8_8_ = 0;
    local_110._M_p = (pointer)&local_100;
    local_100._M_local_buf[0] = '\0';
    local_f0._M_p = (pointer)&local_e0;
    local_e0._M_local_buf[0] = '\0';
    local_d0._M_p = (pointer)&local_c0;
    local_c0._M_local_buf[0] = '\0';
    local_b0._M_p = (pointer)&local_a0;
    local_a0._M_local_buf[0] = '\0';
    local_90._M_p = (pointer)&local_80;
    local_80._M_local_buf[0] = '\0';
    local_70._M_p = (pointer)&local_60;
    local_60._M_local_buf[0] = '\0';
    local_50._M_p = (pointer)&local_40;
    local_40._M_local_buf[0] = '\0';
    local_130._0_8_ = local_130 + 0x10;
    std::__cxx11::string::operator=((string *)&this->Rev,(string *)local_130);
    std::__cxx11::string::operator=((string *)&(this->Rev).Date,(string *)&local_110);
    std::__cxx11::string::operator=((string *)&(this->Rev).Author,(string *)&local_f0);
    std::__cxx11::string::operator=((string *)&(this->Rev).EMail,(string *)&local_d0);
    std::__cxx11::string::operator=((string *)&(this->Rev).Committer,(string *)&local_b0);
    std::__cxx11::string::operator=((string *)&(this->Rev).CommitterEMail,(string *)&local_90);
    std::__cxx11::string::operator=((string *)&(this->Rev).CommitDate,(string *)&local_70);
    std::__cxx11::string::operator=((string *)&(this->Rev).Log,(string *)&local_50);
    cmCTestVC::Revision::~Revision((Revision *)local_130);
    SVar1 = this->Section;
  }
  uVar2 = SVar1 + SectionCount;
  if (-1 < (int)(SVar1 + SectionBody)) {
    uVar2 = SVar1 + SectionBody;
  }
  this->Section = (SVar1 - (uVar2 & 0xfffffffc)) + SectionBody;
  return;
}

Assistant:

void NextSection()
  {
    if (this->Section == SectionDiff) {
      this->P4->DoRevision(this->Rev, this->Changes);
      this->Rev = Revision();
    }

    this->Section = SectionType((this->Section + 1) % SectionCount);
  }